

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppLogger.cpp
# Opt level: O1

void __thiscall CppLogger::CppLogger::setColor(CppLogger *this,Level t_Level,string *t_Color)

{
  if (t_Level - Trace < 5) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&(this->m_TraceColor)._M_dataplus._M_p + (ulong)((t_Level - Trace) * 0x20)),
               t_Color);
    return;
  }
  return;
}

Assistant:

void CppLogger::setColor(Level t_Level, std::string t_Color){
        switch (t_Level) {
            case Level::None:
                break;
            case Level::Trace:
                m_TraceColor = t_Color;
                break;
            case Level::Info:
                m_InfoColor = t_Color;
                break;
            case Level::Warn:
                m_WarnColor = t_Color;
                break;
            case Level::Error:
                m_ErrorColor = t_Color;
                break;
            case Level::FatalError:
                m_FatalErrorColor = t_Color;
                break;
        }
    }